

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::MergeFrom
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  void *pvVar1;
  LogMessage *other;
  Value *pVVar2;
  Value *pVVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x28a7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) &&
     (from->key_ != (Value *)0x0)) {
    pVVar2 = mutable_key(this);
    pVVar3 = from->key_;
    if (pVVar3 == (Value *)0x0) {
      pVVar3 = (Value *)&_Value_default_instance_;
    }
    Value::MergeFrom(pVVar2,pVVar3);
  }
  if ((from != (DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_) &&
     (from->value_ != (Value *)0x0)) {
    pVVar2 = mutable_value(this);
    pVVar3 = from->value_;
    if (pVVar3 == (Value *)0x0) {
      pVVar3 = (Value *)&_Value_default_instance_;
    }
    Value::MergeFrom(pVVar2,pVVar3);
  }
  return;
}

Assistant:

void DictionaryValue_KeyValuePair::MergeFrom(const DictionaryValue_KeyValuePair& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_key()) {
    mutable_key()->::CoreML::Specification::MILSpec::Value::MergeFrom(from.key());
  }
  if (from.has_value()) {
    mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from.value());
  }
}